

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_sw_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  __m256i c;
  __m256i c_00;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  int iVar7;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar8;
  __m256i *palVar9;
  __m256i *b_00;
  char cVar10;
  __m256i *ptr;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  __m256i *palVar15;
  ulong uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined8 in_stack_ffffffffffffff18;
  uint uVar28;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar29;
  undefined4 uVar30;
  ulong local_c8;
  undefined1 auVar20 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar2 = (profile->profile8).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          parasail_sw_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_8_cold_1();
        }
        else {
          iVar7 = ppVar3->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar30 = 0;
            uVar16 = (ulong)uVar1 + 0x1f >> 5;
            result->flag = result->flag | 0x20100804;
            b = parasail_memalign___m256i(0x20,uVar16);
            palVar8 = parasail_memalign___m256i(0x20,uVar16);
            palVar9 = parasail_memalign___m256i(0x20,uVar16);
            b_00 = parasail_memalign___m256i(0x20,uVar16);
            if ((b_00 != (__m256i *)0x0 && palVar9 != (__m256i *)0x0) &&
                (palVar8 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              local_c8 = 0;
              uVar17 = (undefined1)open;
              uVar18 = (undefined1)gap;
              c[1] = (longlong)result;
              c[0] = in_stack_ffffffffffffff18;
              c[2]._0_4_ = iVar7;
              c[2]._4_4_ = in_stack_ffffffffffffff2c;
              c[3]._0_4_ = s2Len;
              c[3]._4_4_ = uVar30;
              parasail_memset___m256i(b,c,uVar16);
              c_00[1] = (longlong)result;
              c_00[0] = in_stack_ffffffffffffff18;
              c_00[2]._0_4_ = iVar7;
              c_00[2]._4_4_ = in_stack_ffffffffffffff2c;
              c_00[3]._0_4_ = s2Len;
              c_00[3]._4_4_ = uVar30;
              parasail_memset___m256i(b_00,c_00,uVar16);
              auVar4[1] = uVar18;
              auVar4[0] = uVar18;
              auVar4[2] = uVar18;
              auVar4[3] = uVar18;
              auVar4[4] = uVar18;
              auVar4[5] = uVar18;
              auVar4[6] = uVar18;
              auVar4[7] = uVar18;
              auVar4[8] = uVar18;
              auVar4[9] = uVar18;
              auVar4[10] = uVar18;
              auVar4[0xb] = uVar18;
              auVar4[0xc] = uVar18;
              auVar4[0xd] = uVar18;
              auVar4[0xe] = uVar18;
              auVar4[0xf] = uVar18;
              auVar4[0x10] = uVar18;
              auVar4[0x11] = uVar18;
              auVar4[0x12] = uVar18;
              auVar4[0x13] = uVar18;
              auVar4[0x14] = uVar18;
              auVar4[0x15] = uVar18;
              auVar4[0x16] = uVar18;
              auVar4[0x17] = uVar18;
              auVar4[0x18] = uVar18;
              auVar4[0x19] = uVar18;
              auVar4[0x1a] = uVar18;
              auVar4[0x1b] = uVar18;
              auVar4[0x1c] = uVar18;
              auVar4[0x1d] = uVar18;
              auVar4[0x1e] = uVar18;
              auVar4[0x1f] = uVar18;
              auVar5[1] = uVar17;
              auVar5[0] = uVar17;
              auVar5[2] = uVar17;
              auVar5[3] = uVar17;
              auVar5[4] = uVar17;
              auVar5[5] = uVar17;
              auVar5[6] = uVar17;
              auVar5[7] = uVar17;
              auVar5[8] = uVar17;
              auVar5[9] = uVar17;
              auVar5[10] = uVar17;
              auVar5[0xb] = uVar17;
              auVar5[0xc] = uVar17;
              auVar5[0xd] = uVar17;
              auVar5[0xe] = uVar17;
              auVar5[0xf] = uVar17;
              auVar5[0x10] = uVar17;
              auVar5[0x11] = uVar17;
              auVar5[0x12] = uVar17;
              auVar5[0x13] = uVar17;
              auVar5[0x14] = uVar17;
              auVar5[0x15] = uVar17;
              auVar5[0x16] = uVar17;
              auVar5[0x17] = uVar17;
              auVar5[0x18] = uVar17;
              auVar5[0x19] = uVar17;
              auVar5[0x1a] = uVar17;
              auVar5[0x1b] = uVar17;
              auVar5[0x1c] = uVar17;
              auVar5[0x1d] = uVar17;
              auVar5[0x1e] = uVar17;
              auVar5[0x1f] = uVar17;
              uVar28 = (uint)uVar16;
              auVar19[8] = 0x80;
              auVar19._0_8_ = 0x8080808080808080;
              auVar19[9] = 0x80;
              auVar19[10] = 0x80;
              auVar19[0xb] = 0x80;
              auVar19[0xc] = 0x80;
              auVar19[0xd] = 0x80;
              auVar19[0xe] = 0x80;
              auVar19[0xf] = 0x80;
              auVar20[0x10] = 0x80;
              auVar20._0_16_ = auVar19;
              auVar20[0x11] = 0x80;
              auVar20[0x12] = 0x80;
              auVar20[0x13] = 0x80;
              auVar20[0x14] = 0x80;
              auVar20[0x15] = 0x80;
              auVar20[0x16] = 0x80;
              auVar20[0x17] = 0x80;
              auVar20[0x18] = 0x80;
              auVar20[0x19] = 0x80;
              auVar20[0x1a] = 0x80;
              auVar20[0x1b] = 0x80;
              auVar20[0x1c] = 0x80;
              auVar20[0x1d] = 0x80;
              auVar20[0x1e] = 0x80;
              auVar20[0x1f] = 0x80;
              cVar10 = -0x80;
              uVar12 = 0;
              auVar23 = ZEXT3264(auVar20);
              auVar21 = ZEXT3264(auVar20);
              do {
                ptr = b;
                iVar13 = ppVar3->mapper[(byte)s2[uVar12]];
                palVar15 = palVar9;
                b = palVar8;
                if ((int)local_c8 == (uint)uVar12 - 2) {
                  palVar15 = palVar8;
                  b = palVar9;
                }
                auVar24 = SUB3216(ptr[uVar28 - 1],0);
                auVar26._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar19;
                auVar26._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar24;
                auVar26 = vpalignr_avx2((undefined1  [32])ptr[uVar28 - 1],auVar26,0xf);
                auVar24 = vpinsrb_avx(auVar26._0_16_,0x80,0);
                auVar26 = vpblendd_avx2(auVar26,ZEXT1632(auVar24),0xf);
                lVar14 = 0;
                auVar25 = ZEXT3264(auVar20);
                do {
                  auVar27 = vpaddsb_avx2(auVar26,*(undefined1 (*) [32])
                                                  ((long)pvVar2 +
                                                  lVar14 + uVar16 * (long)iVar13 * 0x20));
                  auVar26 = *(undefined1 (*) [32])((long)*b_00 + lVar14);
                  auVar22 = vpmaxsb_avx2(auVar26,auVar25._0_32_);
                  auVar27 = vpmaxsb_avx2(auVar27,auVar22);
                  *(undefined1 (*) [32])((long)*b + lVar14) = auVar27;
                  auVar22 = vpmaxsb_avx2(auVar27,auVar21._0_32_);
                  auVar21 = ZEXT3264(auVar22);
                  auVar27 = vpsubsb_avx2(auVar27,auVar5);
                  auVar26 = vpsubsb_avx2(auVar26,auVar4);
                  auVar26 = vpmaxsb_avx2(auVar26,auVar27);
                  *(undefined1 (*) [32])((long)*b_00 + lVar14) = auVar26;
                  auVar26 = vpsubsb_avx2(auVar25._0_32_,auVar4);
                  auVar26 = vpmaxsb_avx2(auVar26,auVar27);
                  auVar25 = ZEXT3264(auVar26);
                  auVar26 = *(undefined1 (*) [32])((long)*ptr + lVar14);
                  lVar14 = lVar14 + 0x20;
                } while (uVar16 << 5 != lVar14);
                iVar13 = 0;
                do {
                  auVar27._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar19;
                  auVar27._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar25._0_16_;
                  auVar26 = vpalignr_avx2(auVar25._0_32_,auVar27,0xf);
                  auVar24 = vpinsrb_avx(auVar26._0_16_,0x80,0);
                  auVar26 = vpblendd_avx2(auVar26,ZEXT1632(auVar24),0xf);
                  auVar25 = ZEXT3264(auVar26);
                  lVar14 = 0;
                  do {
                    auVar26 = vpmaxsb_avx2(auVar25._0_32_,*(undefined1 (*) [32])((long)*b + lVar14))
                    ;
                    *(undefined1 (*) [32])((long)*b + lVar14) = auVar26;
                    auVar27 = vpmaxsb_avx2(auVar26,auVar21._0_32_);
                    auVar21 = ZEXT3264(auVar27);
                    auVar26 = vpsubsb_avx2(auVar26,auVar5);
                    auVar22 = vpsubsb_avx2(auVar25._0_32_,auVar4);
                    auVar25 = ZEXT3264(auVar22);
                    auVar26 = vpcmpgtb_avx2(auVar22,auVar26);
                    if ((((((((((((((((((((((((((((((((auVar26 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar26 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar26 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar26 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar26 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar26 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar26 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar26 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar26 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar26 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar26 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar26 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar26 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar26 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar26 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar26 >> 0x7f,0) == '\0')
                                      && (auVar26 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar26 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar26 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar26 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar26 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar26 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar26 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar26 >> 0xbf,0) == '\0') &&
                              (auVar26 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar26 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar26 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar26 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar26 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar26 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar26[0x1f]) goto LAB_00750b55;
                    lVar14 = lVar14 + 0x20;
                  } while (uVar16 << 5 != lVar14);
                  iVar13 = iVar13 + 1;
                } while (iVar13 != 0x20);
LAB_00750b55:
                auVar26 = vpcmpgtb_avx2(auVar27,auVar23._0_32_);
                bVar6 = true;
                if ((((((((((((((((((((((((((((((((auVar26 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar26 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar26 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar26 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar26 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar26 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar26 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar26 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar26 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar26 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar26 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar26 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar26 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar26 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar26 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar26 >> 0x7f,0) != '\0') ||
                                  (auVar26 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar26 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar26 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar26 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar26 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar26 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0xbf,0) != '\0') ||
                          (auVar26 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar26 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar26 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar26 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar26 = vpermq_avx2(auVar27,0x44);
                  auVar26 = vpmaxsb_avx2(auVar27,auVar26);
                  auVar27 = vpslldq_avx2(auVar26,8);
                  auVar26 = vpmaxsb_avx2(auVar26,auVar27);
                  auVar27 = vpslldq_avx2(auVar26,4);
                  auVar26 = vpmaxsb_avx2(auVar26,auVar27);
                  auVar27 = vpslldq_avx2(auVar26,2);
                  auVar26 = vpmaxsb_avx2(auVar26,auVar27);
                  auVar27 = vpslldq_avx2(auVar26,1);
                  auVar26 = vpmaxsb_avx2(auVar26,auVar27);
                  cVar10 = auVar26[0x17];
                  if ((char)('~' - (char)iVar7) < cVar10) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    bVar6 = false;
                  }
                  else {
                    auVar22[8] = 0xf;
                    auVar22._0_8_ = 0xf0f0f0f0f0f0f0f;
                    auVar22[9] = 0xf;
                    auVar22[10] = 0xf;
                    auVar22[0xb] = 0xf;
                    auVar22[0xc] = 0xf;
                    auVar22[0xd] = 0xf;
                    auVar22[0xe] = 0xf;
                    auVar22[0xf] = 0xf;
                    auVar22[0x10] = 0xf;
                    auVar22[0x11] = 0xf;
                    auVar22[0x12] = 0xf;
                    auVar22[0x13] = 0xf;
                    auVar22[0x14] = 0xf;
                    auVar22[0x15] = 0xf;
                    auVar22[0x16] = 0xf;
                    auVar22[0x17] = 0xf;
                    auVar22[0x18] = 0xf;
                    auVar22[0x19] = 0xf;
                    auVar22[0x1a] = 0xf;
                    auVar22[0x1b] = 0xf;
                    auVar22[0x1c] = 0xf;
                    auVar22[0x1d] = 0xf;
                    auVar22[0x1e] = 0xf;
                    auVar22[0x1f] = 0xf;
                    auVar26 = vpshufb_avx2(auVar26,auVar22);
                    auVar26 = vpermq_avx2(auVar26,0xaa);
                    auVar23 = ZEXT3264(auVar26);
                    local_c8 = uVar12 & 0xffffffff;
                  }
                }
                uVar29 = (uint)uVar12;
                if ((!bVar6) ||
                   (uVar12 = uVar12 + 1, palVar8 = ptr, palVar9 = palVar15, uVar29 = s2Len,
                   uVar12 == (uint)s2Len)) {
                  if (cVar10 == '\x7f') {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar7 = parasail_result_is_saturated(result);
                  palVar8 = palVar15;
                  if (iVar7 == 0) {
                    iVar7 = (int)local_c8;
                    palVar9 = ptr;
                    if (iVar7 == uVar29 - 2) {
                      palVar8 = ptr;
                      palVar9 = palVar15;
                    }
                    if (iVar7 == uVar29 - 1) {
                      palVar8 = b;
                      b = palVar15;
                      palVar9 = ptr;
                    }
                    ptr = palVar9;
                    iVar13 = uVar1 - 1;
                    if (((ulong)uVar1 + 0x1f & 0x7fffffe0) != 0) {
                      uVar16 = 0;
                      do {
                        if ((*(char *)((long)*palVar8 + uVar16) == cVar10) &&
                           (iVar11 = ((uint)uVar16 & 0x1f) * uVar28 +
                                     ((uint)(uVar16 >> 5) & 0x7ffffff), iVar11 < iVar13)) {
                          iVar13 = iVar11;
                        }
                        uVar16 = uVar16 + 1;
                      } while ((uVar28 & 0x3ffffff) << 5 != (int)uVar16);
                    }
                    iVar11 = cVar10 + 0x80;
                  }
                  else {
                    iVar7 = 0;
                    iVar11 = 0xff;
                    iVar13 = 0;
                  }
                  result->score = iVar11;
                  result->end_query = iVar13;
                  result->end_ref = iVar7;
                  parasail_free(b_00);
                  parasail_free(palVar8);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}